

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O2

bool __thiscall
QCache<QPixmapCache::Key,_QPixmapCacheEntry>::insert
          (QCache<QPixmapCache::Key,_QPixmapCacheEntry> *this,Key *key,QPixmapCacheEntry *object,
          qsizetype cost)

{
  long lVar1;
  QPixmapCacheEntry *pQVar2;
  Chain *pCVar3;
  long lVar4;
  Node *n;
  long in_FS_OFFSET;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = this->mx;
  if (lVar1 < cost) {
    remove(this,(char *)key);
    if (object != (QPixmapCacheEntry *)0x0) {
      (*(object->super_QPixmap).super_QPaintDevice._vptr_QPaintDevice[1])(object);
    }
  }
  else {
    trim(this,lVar1 - cost);
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QHashPrivate::Data<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node>::
    findOrInsert<QPixmapCache::Key>((InsertionResult *)local_58,&this->d,key);
    n = (Node *)((*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries +
                (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
                [(uint)local_58._8_8_ & 0x7f]);
    if (local_58[0x10] == true) {
      pQVar2 = (n->value).t;
      lVar4 = (n->value).cost;
      (n->value).t = object;
      (n->value).cost = cost;
      if (pQVar2 != (QPixmapCacheEntry *)0x0) {
        (*(pQVar2->super_QPixmap).super_QPaintDevice._vptr_QPaintDevice[1])();
      }
      relink(this,key);
      lVar4 = cost - lVar4;
    }
    else {
      Node::createInPlace(n,key,object,cost);
      (n->super_Chain).prev = &this->chain;
      pCVar3 = (this->chain).next;
      (n->super_Chain).next = pCVar3;
      pCVar3->prev = (Chain *)n;
      (this->chain).next = (Chain *)n;
      lVar4 = cost;
    }
    this->total = this->total + lVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return cost <= lVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool insert(const Key &key, T *object, qsizetype cost = 1)
    {
        if (cost > mx) {
            remove(key);
            delete object;
            return false;
        }
        trim(mx - cost);
        auto result = d.findOrInsert(key);
        Node *n = result.it.node();
        if (result.initialized) {
            auto prevCost = n->value.cost;
            result.it.node()->emplace(object, cost);
            cost -= prevCost;
            relink(key);
        } else {
            Node::createInPlace(n, key, object, cost);
            n->prev = &chain;
            n->next = chain.next;
            chain.next->prev = n;
            chain.next = n;
        }
        total += cost;
        return true;
    }